

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

CommandLine<Catch::ConfigData> * Catch::makeCommandLineParser(void)

{
  OptBuilder *this;
  ArgBuilder *pAVar1;
  CommandLine<Catch::ConfigData> *in_RDI;
  allocator local_c49;
  string local_c48 [39];
  allocator local_c21;
  string local_c20 [39];
  allocator local_bf9;
  string local_bf8 [32];
  undefined1 local_bd8 [16];
  string local_bc8 [39];
  allocator local_ba1;
  string local_ba0 [32];
  undefined1 local_b80 [16];
  string local_b70 [39];
  allocator local_b49;
  string local_b48 [39];
  allocator local_b21;
  string local_b20 [32];
  undefined1 local_b00 [16];
  string local_af0 [39];
  allocator local_ac9;
  string local_ac8 [39];
  allocator local_aa1;
  string local_aa0 [32];
  undefined1 local_a80 [16];
  string local_a70 [39];
  allocator local_a49;
  string local_a48 [32];
  undefined1 local_a28 [16];
  string local_a18 [39];
  allocator local_9f1;
  string local_9f0 [32];
  undefined1 local_9d0 [16];
  string local_9c0 [39];
  allocator local_999;
  string local_998 [39];
  allocator local_971;
  string local_970 [32];
  undefined1 local_950 [16];
  string local_940 [39];
  allocator local_919;
  string local_918 [39];
  allocator local_8f1;
  string local_8f0 [39];
  allocator local_8c9;
  string local_8c8 [32];
  undefined1 local_8a8 [16];
  string local_898 [39];
  allocator local_871;
  string local_870 [39];
  allocator local_849;
  string local_848 [39];
  allocator local_821;
  string local_820 [32];
  undefined1 local_800 [16];
  string local_7f0 [39];
  allocator local_7c9;
  string local_7c8 [40];
  ArgBuilder local_7a0;
  allocator local_791;
  string local_790 [39];
  allocator local_769;
  string local_768 [39];
  allocator local_741;
  string local_740 [39];
  allocator local_719;
  string local_718 [32];
  undefined1 local_6f8 [16];
  string local_6e8 [39];
  allocator local_6c1;
  string local_6c0 [39];
  allocator local_699;
  string local_698 [39];
  allocator local_671;
  string local_670 [32];
  undefined1 local_650 [16];
  string local_640 [39];
  allocator local_619;
  string local_618 [39];
  allocator local_5f1;
  string local_5f0 [32];
  undefined1 local_5d0 [16];
  string local_5c0 [39];
  allocator local_599;
  string local_598 [39];
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [32];
  undefined1 local_528 [16];
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [32];
  undefined1 local_480 [16];
  string local_470 [39];
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [32];
  undefined1 local_3d8 [16];
  string local_3c8 [39];
  allocator local_3a1;
  string local_3a0 [39];
  allocator local_379;
  string local_378 [32];
  undefined1 local_358 [16];
  string local_348 [39];
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [32];
  undefined1 local_2d8 [16];
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [32];
  undefined1 local_258 [16];
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  undefined1 local_1d8 [16];
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [32];
  undefined1 local_158 [16];
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [32];
  undefined1 local_d8 [16];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50 [32];
  undefined1 local_30 [40];
  CommandLine<Catch::ConfigData> *cli;
  
  local_30[0x1f] = 0;
  Clara::CommandLine<Catch::ConfigData>::CommandLine(in_RDI);
  Clara::CommandLine<Catch::ConfigData>::bindProcessName<Catch::ConfigData,std::__cxx11::string>
            (in_RDI,0x68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"-?",&local_51);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_30,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"-h",&local_79);
  this = Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
                   ((OptBuilder *)local_30,(string *)local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"--help",&local_a1);
  pAVar1 = &Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[](this,(string *)local_a0)->
            super_ArgBuilder;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"display usage information",(allocator *)(local_d8 + 0xf));
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe(pAVar1,(string *)local_c8);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>(pAVar1,7);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)(local_d8 + 0xf));
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"-l",&local_f9);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_d8,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"--list-tests",&local_121);
  pAVar1 = &Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
                      ((OptBuilder *)local_d8,(string *)local_120)->super_ArgBuilder;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_148,"list all/matching test cases",(allocator *)(local_158 + 0xf));
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe(pAVar1,(string *)local_148);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>(pAVar1,0);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)(local_158 + 0xf));
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"-t",&local_179);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_158,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"--list-tags",&local_1a1);
  pAVar1 = &Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
                      ((OptBuilder *)local_158,(string *)local_1a0)->super_ArgBuilder;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"list all/matching tags",(allocator *)(local_1d8 + 0xf));
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe(pAVar1,(string *)local_1c8);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>(pAVar1,1);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)(local_1d8 + 0xf));
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"-s",&local_1f9);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_1d8,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"--success",&local_221);
  pAVar1 = &Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
                      ((OptBuilder *)local_1d8,(string *)local_220)->super_ArgBuilder;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_248,"include successful tests in output",(allocator *)(local_258 + 0xf));
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe(pAVar1,(string *)local_248);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>(pAVar1,4);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)(local_258 + 0xf));
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"-b",&local_279);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_258,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"--break",&local_2a1);
  pAVar1 = &Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
                      ((OptBuilder *)local_258,(string *)local_2a0)->super_ArgBuilder;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2c8,"break into debugger on failure",(allocator *)(local_2d8 + 0xf));
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe(pAVar1,(string *)local_2c8);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>(pAVar1,5);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)(local_2d8 + 0xf));
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"-e",&local_2f9);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_2d8,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"--nothrow",&local_321);
  pAVar1 = &Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
                      ((OptBuilder *)local_2d8,(string *)local_320)->super_ArgBuilder;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"skip exception tests",(allocator *)(local_358 + 0xf));
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe(pAVar1,(string *)local_348);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>(pAVar1,6);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)(local_358 + 0xf));
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"-i",&local_379);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_358,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a0,"--invisibles",&local_3a1);
  pAVar1 = &Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
                      ((OptBuilder *)local_358,(string *)local_3a0)->super_ArgBuilder;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3c8,"show invisibles (tabs, newlines)",(allocator *)(local_3d8 + 0xf));
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe(pAVar1,(string *)local_3c8);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>(pAVar1,8);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)(local_3d8 + 0xf));
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f8,"-o",&local_3f9);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_3d8,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"--out",&local_421);
  pAVar1 = &Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
                      ((OptBuilder *)local_3d8,(string *)local_420)->super_ArgBuilder;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"output filename",&local_449);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe(pAVar1,(string *)local_448);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_470,"filename",(allocator *)(local_480 + 0xf));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,std::__cxx11::string>
            (pAVar1,0x28,(string *)local_470);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator((allocator<char> *)(local_480 + 0xf));
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"-r",&local_4a1);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_480,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c8,"--reporter",&local_4c9);
  pAVar1 = &Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
                      ((OptBuilder *)local_480,(string *)local_4c8)->super_ArgBuilder;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f0,"reporter to use (defaults to console)",&local_4f1);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe(pAVar1,(string *)local_4f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"name",(allocator *)(local_528 + 0xf));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>(pAVar1,addReporterName,(string *)local_518);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)(local_528 + 0xf));
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"-n",&local_549);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_528,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"--name",&local_571);
  pAVar1 = &Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
                      ((OptBuilder *)local_528,(string *)local_570)->super_ArgBuilder;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_598,"suite name",&local_599);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe(pAVar1,(string *)local_598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c0,"name",(allocator *)(local_5d0 + 0xf));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,std::__cxx11::string>
            (pAVar1,0x48,(string *)local_5c0);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)(local_5d0 + 0xf));
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5f0,"-a",&local_5f1);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_5d0,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_618,"--abort",&local_619);
  pAVar1 = &Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
                      ((OptBuilder *)local_5d0,(string *)local_618)->super_ArgBuilder;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_640,"abort at first failure",(allocator *)(local_650 + 0xf));
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe(pAVar1,(string *)local_640);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>(pAVar1,abortAfterFirst)
  ;
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator((allocator<char> *)(local_650 + 0xf));
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  std::__cxx11::string::~string(local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_670,"-x",&local_671);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_650,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_698,"--abortx",&local_699);
  pAVar1 = &Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
                      ((OptBuilder *)local_650,(string *)local_698)->super_ArgBuilder;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c0,"abort after x failures",&local_6c1);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe(pAVar1,(string *)local_6c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6e8,"no. failures",(allocator *)(local_6f8 + 0xf));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,int>
            (pAVar1,abortAfterX,(string *)local_6e8);
  std::__cxx11::string::~string(local_6e8);
  std::allocator<char>::~allocator((allocator<char> *)(local_6f8 + 0xf));
  std::__cxx11::string::~string(local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  std::__cxx11::string::~string(local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  std::__cxx11::string::~string(local_670);
  std::allocator<char>::~allocator((allocator<char> *)&local_671);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_718,"-w",&local_719);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_6f8,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_740,"--warn",&local_741);
  pAVar1 = &Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
                      ((OptBuilder *)local_6f8,(string *)local_740)->super_ArgBuilder;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_768,"enable warnings",&local_769);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe(pAVar1,(string *)local_768);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_790,"warning name",&local_791);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>(pAVar1,addWarning,(string *)local_790);
  std::__cxx11::string::~string(local_790);
  std::allocator<char>::~allocator((allocator<char> *)&local_791);
  std::__cxx11::string::~string(local_768);
  std::allocator<char>::~allocator((allocator<char> *)&local_769);
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator((allocator<char> *)&local_741);
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  local_7a0 = Clara::CommandLine<Catch::ConfigData>::operator[](in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c8,"which test or tests to use",&local_7c9);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
                     (&local_7a0,(string *)local_7c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7f0,"test name, pattern or tags",(allocator *)(local_800 + 0xf));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>(pAVar1,addTestOrTags,(string *)local_7f0);
  std::__cxx11::string::~string(local_7f0);
  std::allocator<char>::~allocator((allocator<char> *)(local_800 + 0xf));
  std::__cxx11::string::~string(local_7c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_820,"-d",&local_821);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_800,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_848,"--durations",&local_849);
  pAVar1 = &Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
                      ((OptBuilder *)local_800,(string *)local_848)->super_ArgBuilder;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_870,"show test durations",&local_871);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe(pAVar1,(string *)local_870);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_898,"yes|no",(allocator *)(local_8a8 + 0xf));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,bool>
            (pAVar1,setShowDurations,(string *)local_898);
  std::__cxx11::string::~string(local_898);
  std::allocator<char>::~allocator((allocator<char> *)(local_8a8 + 0xf));
  std::__cxx11::string::~string(local_870);
  std::allocator<char>::~allocator((allocator<char> *)&local_871);
  std::__cxx11::string::~string(local_848);
  std::allocator<char>::~allocator((allocator<char> *)&local_849);
  std::__cxx11::string::~string(local_820);
  std::allocator<char>::~allocator((allocator<char> *)&local_821);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8c8,"-f",&local_8c9);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_8a8,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8f0,"--input-file",&local_8f1);
  pAVar1 = &Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
                      ((OptBuilder *)local_8a8,(string *)local_8f0)->super_ArgBuilder;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_918,"load test names to run from a file",&local_919);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe(pAVar1,(string *)local_918);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_940,"filename",(allocator *)(local_950 + 0xf));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            (pAVar1,loadTestNamesFromFile,(string *)local_940);
  std::__cxx11::string::~string(local_940);
  std::allocator<char>::~allocator((allocator<char> *)(local_950 + 0xf));
  std::__cxx11::string::~string(local_918);
  std::allocator<char>::~allocator((allocator<char> *)&local_919);
  std::__cxx11::string::~string(local_8f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
  std::__cxx11::string::~string(local_8c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_970,"-#",&local_971);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_950,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_998,"--filenames-as-tags",&local_999);
  pAVar1 = &Clara::CommandLine<Catch::ConfigData>::OptBuilder::operator[]
                      ((OptBuilder *)local_950,(string *)local_998)->super_ArgBuilder;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_9c0,"adds a tag for the filename",(allocator *)(local_9d0 + 0xf));
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe(pAVar1,(string *)local_9c0);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>(pAVar1,9);
  std::__cxx11::string::~string(local_9c0);
  std::allocator<char>::~allocator((allocator<char> *)(local_9d0 + 0xf));
  std::__cxx11::string::~string(local_998);
  std::allocator<char>::~allocator((allocator<char> *)&local_999);
  std::__cxx11::string::~string(local_970);
  std::allocator<char>::~allocator((allocator<char> *)&local_971);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9f0,"--list-test-names-only",&local_9f1);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_9d0,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a18,"list all/matching test cases names only",(allocator *)(local_a28 + 0xf));
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
                     ((ArgBuilder *)local_9d0,(string *)local_a18);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>(pAVar1,3);
  std::__cxx11::string::~string(local_a18);
  std::allocator<char>::~allocator((allocator<char> *)(local_a28 + 0xf));
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a48,"--list-reporters",&local_a49);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_a28,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a70,"list all reporters",(allocator *)(local_a80 + 0xf));
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
                     ((ArgBuilder *)local_a28,(string *)local_a70);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>(pAVar1,2);
  std::__cxx11::string::~string(local_a70);
  std::allocator<char>::~allocator((allocator<char> *)(local_a80 + 0xf));
  std::__cxx11::string::~string(local_a48);
  std::allocator<char>::~allocator((allocator<char> *)&local_a49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_aa0,"--order",&local_aa1);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_a80,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac8,"test case order (defaults to decl)",&local_ac9);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
                     ((ArgBuilder *)local_a80,(string *)local_ac8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_af0,"decl|lex|rand",(allocator *)(local_b00 + 0xf));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>(pAVar1,setOrder,(string *)local_af0);
  std::__cxx11::string::~string(local_af0);
  std::allocator<char>::~allocator((allocator<char> *)(local_b00 + 0xf));
  std::__cxx11::string::~string(local_ac8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
  std::__cxx11::string::~string(local_aa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b20,"--rng-seed",&local_b21);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_b00,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b48,"set a specific seed for random numbers",&local_b49);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
                     ((ArgBuilder *)local_b00,(string *)local_b48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b70,"\'time\'|number",(allocator *)(local_b80 + 0xf));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>(pAVar1,setRngSeed,(string *)local_b70);
  std::__cxx11::string::~string(local_b70);
  std::allocator<char>::~allocator((allocator<char> *)(local_b80 + 0xf));
  std::__cxx11::string::~string(local_b48);
  std::allocator<char>::~allocator((allocator<char> *)&local_b49);
  std::__cxx11::string::~string(local_b20);
  std::allocator<char>::~allocator((allocator<char> *)&local_b21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ba0,"--force-colour",&local_ba1);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_b80,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_bc8,"force colourised output (deprecated)",(allocator *)(local_bd8 + 0xf));
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
                     ((ArgBuilder *)local_b80,(string *)local_bc8);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>(pAVar1,forceColour);
  std::__cxx11::string::~string(local_bc8);
  std::allocator<char>::~allocator((allocator<char> *)(local_bd8 + 0xf));
  std::__cxx11::string::~string(local_ba0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ba1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bf8,"--use-colour",&local_bf9);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_bd8,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c20,"should output be colourised",&local_c21);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBuilder::describe
                     ((ArgBuilder *)local_bd8,(string *)local_c20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c48,"yes|no",&local_c49);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>(pAVar1,setUseColour,(string *)local_c48);
  std::__cxx11::string::~string(local_c48);
  std::allocator<char>::~allocator((allocator<char> *)&local_c49);
  std::__cxx11::string::~string(local_c20);
  std::allocator<char>::~allocator((allocator<char> *)&local_c21);
  std::__cxx11::string::~string(local_bf8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf9);
  return in_RDI;
}

Assistant:

inline Clara::CommandLine<ConfigData> makeCommandLineParser() {

		using namespace Clara;
		CommandLine<ConfigData> cli;

		cli.bindProcessName(&ConfigData::processName);

		cli["-?"]["-h"]["--help"]
			.describe("display usage information")
			.bind(&ConfigData::showHelp);

		cli["-l"]["--list-tests"]
			.describe("list all/matching test cases")
			.bind(&ConfigData::listTests);

		cli["-t"]["--list-tags"]
			.describe("list all/matching tags")
			.bind(&ConfigData::listTags);

		cli["-s"]["--success"]
			.describe("include successful tests in output")
			.bind(&ConfigData::showSuccessfulTests);

		cli["-b"]["--break"]
			.describe("break into debugger on failure")
			.bind(&ConfigData::shouldDebugBreak);

		cli["-e"]["--nothrow"]
			.describe("skip exception tests")
			.bind(&ConfigData::noThrow);

		cli["-i"]["--invisibles"]
			.describe("show invisibles (tabs, newlines)")
			.bind(&ConfigData::showInvisibles);

		cli["-o"]["--out"]
			.describe("output filename")
			.bind(&ConfigData::outputFilename, "filename");

		cli["-r"]["--reporter"]
			//            .placeholder( "name[:filename]" )
			.describe("reporter to use (defaults to console)")
			.bind(&addReporterName, "name");

		cli["-n"]["--name"]
			.describe("suite name")
			.bind(&ConfigData::name, "name");

		cli["-a"]["--abort"]
			.describe("abort at first failure")
			.bind(&abortAfterFirst);

		cli["-x"]["--abortx"]
			.describe("abort after x failures")
			.bind(&abortAfterX, "no. failures");

		cli["-w"]["--warn"]
			.describe("enable warnings")
			.bind(&addWarning, "warning name");

		// - needs updating if reinstated
		//        cli.into( &setVerbosity )
		//            .describe( "level of verbosity (0=no output)" )
		//            .shortOpt( "v")
		//            .longOpt( "verbosity" )
		//            .placeholder( "level" );

		cli[_]
			.describe("which test or tests to use")
			.bind(&addTestOrTags, "test name, pattern or tags");

		cli["-d"]["--durations"]
			.describe("show test durations")
			.bind(&setShowDurations, "yes|no");

		cli["-f"]["--input-file"]
			.describe("load test names to run from a file")
			.bind(&loadTestNamesFromFile, "filename");

		cli["-#"]["--filenames-as-tags"]
			.describe("adds a tag for the filename")
			.bind(&ConfigData::filenamesAsTags);

		// Less common commands which don't have a short form
		cli["--list-test-names-only"]
			.describe("list all/matching test cases names only")
			.bind(&ConfigData::listTestNamesOnly);

		cli["--list-reporters"]
			.describe("list all reporters")
			.bind(&ConfigData::listReporters);

		cli["--order"]
			.describe("test case order (defaults to decl)")
			.bind(&setOrder, "decl|lex|rand");

		cli["--rng-seed"]
			.describe("set a specific seed for random numbers")
			.bind(&setRngSeed, "'time'|number");

		cli["--force-colour"]
			.describe("force colourised output (deprecated)")
			.bind(&forceColour);

		cli["--use-colour"]
			.describe("should output be colourised")
			.bind(&setUseColour, "yes|no");

		return cli;
	}